

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (window->Scroll).x;
  fVar8 = (window->Scroll).y;
  fVar7 = (window->ScrollTarget).x;
  if (fVar7 < 3.4028235e+38) {
    fVar6 = fVar7 - ((window->SizeFull).x - (window->ScrollbarSizes).x) *
                    (window->ScrollTargetCenterRatio).x;
  }
  fVar7 = (window->ScrollTarget).y;
  if (fVar7 < 3.4028235e+38) {
    fVar8 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar8 <= 0.0)) && (fVar7 <= (window->WindowPadding).y)) {
      fVar7 = 0.0;
    }
    if (((snap_on_edges) && (1.0 <= fVar8)) &&
       (fVar2 = (window->SizeContents).y,
       (fVar2 - (window->WindowPadding).y) + (GImGui->Style).ItemSpacing.y <= fVar7)) {
      fVar7 = fVar2;
    }
    fVar2 = ImGuiWindow::TitleBarHeight(window);
    fVar3 = ImGuiWindow::MenuBarHeight(window);
    fVar8 = (fVar7 - (fVar3 + fVar2) * (1.0 - fVar8)) -
            ((window->SizeFull).y - (window->ScrollbarSizes).y) * fVar8;
  }
  IVar4.x = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
  IVar4.y = (float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  auVar5._8_8_ = 0;
  auVar5._0_4_ = IVar4.x;
  auVar5._4_4_ = IVar4.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar7 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
    fVar6 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
    auVar1._4_4_ = -(uint)(0.0 < fVar6) & (uint)fVar6;
    auVar1._0_4_ = -(uint)(0.0 < fVar7) & (uint)fVar7;
    auVar1._8_8_ = 0;
    auVar5 = minps(auVar5,auVar1);
    IVar4 = auVar5._0_8_;
  }
  return IVar4;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        scroll.x = window->ScrollTarget.x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->SizeContents.y - window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->SizeContents.y;
        scroll.y = target_y - (1.0f - cr_y) * (window->TitleBarHeight() + window->MenuBarHeight()) - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, ImGui::GetWindowScrollMaxX(window));
        scroll.y = ImMin(scroll.y, ImGui::GetWindowScrollMaxY(window));
    }
    return scroll;
}